

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void av1_xform_quant(MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                    BLOCK_SIZE plane_bsize,TxfmParam *txfm_param,QUANT_PARAM *qparam)

{
  undefined3 in_register_00000089;
  
  av1_fwd_txfm(x->plane[plane].src_diff +
               (int)((blk_row * (uint)block_size_wide[CONCAT31(in_register_00000089,plane_bsize)] +
                     blk_col) * 4),x->plane[plane].coeff + (block << 4),
               (uint)block_size_wide[CONCAT31(in_register_00000089,plane_bsize)],txfm_param);
  av1_quant(x,plane,block,txfm_param,qparam);
  return;
}

Assistant:

void av1_xform_quant(MACROBLOCK *x, int plane, int block, int blk_row,
                     int blk_col, BLOCK_SIZE plane_bsize, TxfmParam *txfm_param,
                     const QUANT_PARAM *qparam) {
  av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, txfm_param);
  av1_quant(x, plane, block, txfm_param, qparam);
}